

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-output.c
# Opt level: O2

_Bool panel_should_modify(term_conflict *t,wchar_t wy,wchar_t wx)

{
  int iVar1;
  int iVar2;
  wchar_t wVar3;
  wchar_t wVar4;
  _Bool _Var5;
  
  if ((term_conflict *)angband_term[0] == t) {
    iVar1 = Term->sidebar_mode;
    iVar2 = (Term->hgt - (row_top_map[iVar1] + row_bottom_map[iVar1])) / (int)(uint)tile_height;
    wVar3 = ~col_map[iVar1] + Term->wid;
  }
  else {
    wVar3 = t->wid;
    iVar2 = t->hgt / (int)(uint)tile_height;
  }
  wVar4 = cave->height - iVar2;
  if (wy <= wVar4) {
    wVar4 = wy;
  }
  if (wVar4 < L'\x01') {
    wVar4 = L'\0';
  }
  _Var5 = true;
  if (t->offset_y == wVar4) {
    wVar3 = cave->width - wVar3 / (int)(uint)tile_width;
    if (wx <= wVar3) {
      wVar3 = wx;
    }
    wVar4 = L'\0';
    if (L'\0' < wVar3) {
      wVar4 = wVar3;
    }
    _Var5 = t->offset_x != wVar4;
  }
  return _Var5;
}

Assistant:

bool panel_should_modify(term *t, int wy, int wx)
{
	int dungeon_hgt = cave->height;
	int dungeon_wid = cave->width;
	int screen_hgt = (t == angband_term[0]) ?
		SCREEN_HGT : t->hgt / tile_height;
	int screen_wid = (t == angband_term[0]) ?
		SCREEN_WID : t->wid / tile_width;

	/* Verify wy, adjust if needed */
	if (wy > dungeon_hgt - screen_hgt) wy = dungeon_hgt - screen_hgt;
	if (wy < 0) wy = 0;

	/* Verify wx, adjust if needed */
	if (wx > dungeon_wid - screen_wid) wx = dungeon_wid - screen_wid;
	if (wx < 0) wx = 0;

	/* Needs changes? */
	return ((t->offset_y != wy) || (t->offset_x != wx));
}